

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTest<SplitCompilationTest,_testing::internal::TemplateSel<SplitCompilationTest_empty_deque_long_Test>,_testing::internal::Types<char32_t>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  CodeLocation CVar1;
  SetUpTearDownSuiteFuncType p_Var2;
  SetUpTearDownSuiteFuncType p_Var3;
  undefined8 *puVar4;
  char *__rhs;
  char *str;
  undefined8 uVar5;
  undefined8 in_stack_fffffffffffffe98;
  TestFactoryBase *in_stack_fffffffffffffea8;
  TestFactoryBase *pTVar6;
  string local_138;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  CodeLocation local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,prefix,(allocator<char> *)&stack0xfffffffffffffe9f);
  __rhs = "/";
  if (*prefix == '\0') {
    __rhs = "";
  }
  std::operator+(&local_f8,&local_50,__rhs);
  std::operator+(&local_d8,&local_f8,case_name);
  std::operator+(&local_b8,&local_d8,"/");
  std::operator+(&local_98,&local_b8,
                 (type_names->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + index);
  GetPrefixUntilComma_abi_cxx11_(&local_138,(internal *)test_names,str);
  StripTrailingSpaces(&local_118,&local_138);
  GetTypeName<char32_t>();
  pTVar6 = in_stack_fffffffffffffea8;
  CodeLocation::CodeLocation(&local_78,code_location);
  p_Var2 = SuiteApiResolver<SplitCompilationTest_empty_deque_long_Test<char32_t>_>::
           GetSetUpCaseOrSuite((code_location->file)._M_dataplus._M_p,code_location->line);
  p_Var3 = SuiteApiResolver<SplitCompilationTest_empty_deque_long_Test<char32_t>_>::
           GetTearDownCaseOrSuite((code_location->file)._M_dataplus._M_p,code_location->line);
  uVar5 = 0x310a49;
  puVar4 = (undefined8 *)operator_new(8);
  *puVar4 = &PTR__TestFactoryBase_004b3670;
  CVar1.file._M_string_length = (size_type)p_Var3;
  CVar1.file._M_dataplus._M_p = (pointer)p_Var2;
  CVar1.file.field_2._M_allocated_capacity = (size_type)puVar4;
  CVar1.file.field_2._8_8_ = uVar5;
  CVar1._32_8_ = in_stack_fffffffffffffe98;
  testing::internal::MakeAndRegisterTestInfo
            (local_98._M_dataplus._M_p,local_118._M_dataplus._M_p,(char *)in_stack_fffffffffffffea8,
             (char *)0x0,CVar1,&local_78,
             (_func_void *)&TypeIdHelper<SplitCompilationTest<char32_t>>::dummy_,
             (_func_void *)test_names,pTVar6);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_50);
  return true;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }